

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

bool nite::isUpper(string *Input)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = Input->_M_string_length;
  if (uVar1 == 0) {
    bVar4 = true;
  }
  else {
    pcVar2 = (Input->_M_dataplus)._M_p;
    uVar6 = 0;
    uVar7 = 1;
    do {
      iVar5 = isupper((int)pcVar2[uVar6]);
      bVar4 = iVar5 != 0;
      if (iVar5 == 0) {
        return bVar4;
      }
      bVar3 = uVar7 < uVar1;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  return bVar4;
}

Assistant:

bool nite::isUpper(const String &Input){
	for (unsigned i=0; i<Input.length(); i++){
		char c = Input.at(i);
		if (!isupper(c))
			return 0;
	}
	return 1;
}